

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::Remove(CopyRemovePolicy<JsUtil::List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
         *this,List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *list,TElementType *item)

{
  uint uVar1;
  Type ppPVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  ppPVar2 = (list->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer;
  uVar1 = (list->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
  uVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  while( true ) {
    if (uVar5 == uVar3) {
      return;
    }
    if (ppPVar2[uVar3] == *item) break;
    uVar3 = uVar3 + 1;
  }
  for (lVar4 = (long)((int)uVar3 + 1); (int)lVar4 < (int)uVar1; lVar4 = lVar4 + 1) {
    ppPVar2[(int)uVar3] = ppPVar2[lVar4];
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  (list->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count = uVar1 - 1
  ;
  ppPVar2[(long)(int)uVar1 + -1] = (Probe *)0x0;
  return;
}

Assistant:

void Remove(TListType* list, const TElementType& item)
        {
            TElementType* buffer = list->buffer;
            int& count = list->count;

            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(buffer[i], item))
                {
                    for (int j = i + 1; j < count; i++, j++)
                    {
                        buffer[i] = buffer[j];
                    }
                    count--;

                    if (clearOldEntries)
                    {
                        ClearArray(buffer + count, 1);
                    }
                    break;
                }
            }
        }